

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

Parser * new_subparser(Parser *p)

{
  Parser *pp_00;
  Parser *pp;
  Parser *p_local;
  
  pp_00 = (Parser *)new_D_Parser(p->t,(p->user).sizeof_user_parse_node);
  copy_user_configurables(pp_00,p);
  pp_00->end = p->end;
  pp_00->pinterface1 = p->pinterface1;
  alloc_parser_working_data(pp_00);
  return pp_00;
}

Assistant:

Parser *new_subparser(Parser *p) {
  Parser *pp = (Parser *)new_D_Parser(p->t, p->user.sizeof_user_parse_node);
  copy_user_configurables(pp, p);
  pp->end = p->end;
  pp->pinterface1 = p->pinterface1;
  alloc_parser_working_data(pp);
  return pp;
}